

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

intptr_t __thiscall Inline::TryOptimizeInstrWithFixedDataProperty(Inline *this,Instr **instr)

{
  SymOpnd *this_00;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  uint uVar4;
  uint uVar5;
  JITTimeFunctionBody *pJVar6;
  FunctionJITTimeInfo *pFVar7;
  undefined4 *puVar8;
  intptr_t iVar9;
  
  pJVar6 = JITTimeWorkItem::GetJITFunctionBody((*instr)->m_func->m_workItem);
  uVar4 = JITTimeFunctionBody::GetSourceContextId(pJVar6);
  pFVar7 = JITTimeWorkItem::GetJITTimeInfo((*instr)->m_func->m_workItem);
  uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar7);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,UseFixedDataPropsPhase,uVar4,uVar5);
  if (!bVar2) {
    pJVar6 = JITTimeWorkItem::GetJITFunctionBody((*instr)->m_func->m_workItem);
    uVar4 = JITTimeFunctionBody::GetSourceContextId(pJVar6);
    pFVar7 = JITTimeWorkItem::GetJITTimeInfo((*instr)->m_func->m_workItem);
    uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar7);
    bVar2 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015a4e90,UseFixedDataPropsInInlinerPhase,uVar4,uVar5);
    if ((!bVar2) && ((*instr)->m_kind == InstrKindProfiled)) {
      OVar3 = IR::Opnd::GetKind((*instr)->m_src1);
      if (OVar3 == OpndKindSym) {
        this_00 = (SymOpnd *)(*instr)->m_src1;
        OVar3 = IR::Opnd::GetKind((Opnd *)this_00);
        if (OVar3 != OpndKindSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar8 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar8 = 0;
        }
        bVar2 = IR::SymOpnd::IsPropertySymOpnd(this_00);
        if (bVar2) {
          bVar2 = OpCodeAttr::CanLoadFixedFields((*instr)->m_opcode);
          if (bVar2) {
            iVar9 = IR::Instr::TryOptimizeInstrWithFixedDataProperty(*instr,instr,(GlobOpt *)0x0);
            return iVar9;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

intptr_t
Inline::TryOptimizeInstrWithFixedDataProperty(IR::Instr *&instr)
{
    if (PHASE_OFF(Js::UseFixedDataPropsPhase, instr->m_func) ||
        PHASE_OFF(Js::UseFixedDataPropsInInlinerPhase, instr->m_func))
    {
        return 0;
    }
    if (!instr->IsProfiledInstr() ||
        !instr->GetSrc1()->IsSymOpnd() || !instr->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd())
    {
        return 0;
    }
    if (!OpCodeAttr::CanLoadFixedFields(instr->m_opcode))
    {
        return 0;
    }
    return instr->TryOptimizeInstrWithFixedDataProperty(&instr, nullptr);
}